

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3BeginTransaction(Parse *pParse,int type)

{
  sqlite3 *psVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  Vdbe *p;
  long lVar5;
  long lVar6;
  
  psVar1 = pParse->db;
  iVar3 = sqlite3AuthCheck(pParse,0x16,"BEGIN",(char *)0x0,(char *)0x0);
  if (iVar3 == 0) {
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      if ((type != 7) && (0 < psVar1->nDb)) {
        lVar5 = 8;
        lVar6 = 0;
        do {
          lVar2 = *(long *)((long)&psVar1->aDb->zDbSName + lVar5);
          if ((lVar2 == 0) || (iVar3 = 0, (*(byte *)(*(long *)(lVar2 + 8) + 0x28) & 1) == 0)) {
            iVar3 = (type == 9) + 1;
          }
          sqlite3VdbeAddOp3(p,2,(int)lVar6,iVar3,0);
          uVar4 = 1 << ((byte)lVar6 & 0x1f);
          p->btreeMask = p->btreeMask | uVar4;
          if ((lVar6 != 1) &&
             (*(char *)(*(long *)((long)&p->db->aDb->zDbSName + lVar5) + 0x11) != '\0')) {
            p->lockMask = p->lockMask | uVar4;
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 0x20;
        } while (lVar6 < psVar1->nDb);
      }
      sqlite3VdbeAddOp3(p,1,0,0,0);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTransaction(Parse *pParse, int type){
  sqlite3 *db;
  Vdbe *v;
  int i;

  assert( pParse!=0 );
  db = pParse->db;
  assert( db!=0 );
  if( sqlite3AuthCheck(pParse, SQLITE_TRANSACTION, "BEGIN", 0, 0) ){
    return;
  }
  v = sqlite3GetVdbe(pParse);
  if( !v ) return;
  if( type!=TK_DEFERRED ){
    for(i=0; i<db->nDb; i++){
      int eTxnType;
      Btree *pBt = db->aDb[i].pBt;
      if( pBt && sqlite3BtreeIsReadonly(pBt) ){
        eTxnType = 0;  /* Read txn */
      }else if( type==TK_EXCLUSIVE ){
        eTxnType = 2;  /* Exclusive txn */
      }else{
        eTxnType = 1;  /* Write txn */
      }
      sqlite3VdbeAddOp2(v, OP_Transaction, i, eTxnType);
      sqlite3VdbeUsesBtree(v, i);
    }
  }
  sqlite3VdbeAddOp0(v, OP_AutoCommit);
}